

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

cmStateSnapshot * __thiscall
cmState::CreatePolicyScopeSnapshot
          (cmStateSnapshot *__return_storage_ptr__,cmState *this,cmStateSnapshot *originSnapshot)

{
  iterator it;
  PositionType PVar1;
  ReferenceType __src;
  PointerType pSVar2;
  PointerType pBVar3;
  PointerType pSVar4;
  PositionType pos;
  SnapshotDataType local_1d0;
  undefined1 local_100 [208];
  
  it.Tree = (originSnapshot->Position).Tree;
  it.Position = (originSnapshot->Position).Position;
  __src = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator*
                    (&originSnapshot->Position);
  memcpy(local_100,__src,0xd0);
  memcpy(&local_1d0,local_100,0xd0);
  local_1d0.ScopeParent =
       cmLinkedTree<cmStateDetail::SnapshotDataType>::Push_impl(&this->SnapshotData,it,&local_1d0);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_1d0.ScopeParent);
  pSVar2->SnapshotType = PolicyScopeType;
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_1d0.ScopeParent);
  pSVar2->Keep = false;
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_1d0.ScopeParent);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar2->BuildSystemDirectory);
  (pBVar3->DirectoryEnd).Tree = local_1d0.ScopeParent.Tree;
  (pBVar3->DirectoryEnd).Position = local_1d0.ScopeParent.Position;
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&originSnapshot->Position);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_1d0.ScopeParent);
  PVar1 = (pSVar2->Policies).Position;
  (pSVar4->PolicyScope).Tree = (pSVar2->Policies).Tree;
  (pSVar4->PolicyScope).Position = PVar1;
  cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,local_1d0.ScopeParent);
  return __return_storage_ptr__;
}

Assistant:

cmStateSnapshot cmState::CreatePolicyScopeSnapshot(
  cmStateSnapshot const& originSnapshot)
{
  cmStateDetail::PositionType pos =
    this->SnapshotData.Push(originSnapshot.Position, *originSnapshot.Position);
  pos->SnapshotType = cmStateEnums::PolicyScopeType;
  pos->Keep = false;
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  return cmStateSnapshot(this, pos);
}